

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_runtime.c
# Opt level: O3

void interop_kmp_omp_thread_launcher(int gtid)

{
  kmp_info_t *pkVar1;
  undefined8 *puVar2;
  
  pkVar1 = __kmp_threads[gtid];
  puVar2 = (undefined8 *)(pkVar1->th).interop_thr;
  (*(code *)*puVar2)(puVar2[1]);
  *(undefined4 *)(puVar2 + 3) = 1;
  __kmp_free_team((pkVar1->th).th_root,(pkVar1->th).th_team,(kmp_info_t *)0x0);
  return;
}

Assistant:

void static interop_kmp_omp_thread_launcher(int gtid) {
    kmp_info_t * kmp_thread = __kmp_threads[gtid];
    omp_thread_t * th = (omp_thread_t*) kmp_thread->th.interop_thr;
    if (th->new_stack) {
        /* use setjmp/longjmp pair to change stack */
    }
    th->start_routine(th->arg);
    th->join_counter = 1;

    if (th->new_stack) {
        /* use setjmp/longjmp pair to change back to the original stack */
    }

    /* the free team will not free the original master thread, it will return the team and the thread back to the pool */
    kmp_team_t * team = kmp_thread->th.th_team;
    __kmp_free_team(kmp_thread->th.th_root, team, NULL);
}